

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::CameraTransform::CameraTransform(CameraTransform *this,AnimatedTransform *worldFromCamera)

{
  int iVar1;
  long in_RSI;
  Transform *in_RDI;
  undefined1 auVar4 [56];
  undefined1 auVar2 [64];
  Point3f PVar5;
  Point3<float> PVar6;
  Transform rfc [2];
  Transform renderFromWorld;
  Point3f pCamera;
  Float tMid_1;
  Float tMid;
  float in_stack_fffffffffffff958;
  float in_stack_fffffffffffff95c;
  Transform *in_stack_fffffffffffff960;
  float fVar7;
  undefined1 local_680 [32];
  Point3<float> *in_stack_fffffffffffff9a0;
  char *in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9b4;
  char *in_stack_fffffffffffff9b8;
  LogLevel in_stack_fffffffffffff9c4;
  Transform *in_stack_fffffffffffff9e8;
  Transform *in_stack_fffffffffffff9f0;
  char *in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa14;
  char *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  LogLevel in_stack_fffffffffffffa24;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffa2c;
  Float in_stack_fffffffffffffa84;
  AnimatedTransform *in_stack_fffffffffffffa88;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffaa0;
  Transform *in_stack_fffffffffffffae8;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffb00;
  Float in_stack_fffffffffffffd5c;
  AnimatedTransform *in_stack_fffffffffffffd60;
  undefined1 local_210 [128];
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_164;
  undefined4 local_15c;
  undefined1 local_158 [128];
  undefined8 local_d8;
  float local_d0;
  Float in_stack_ffffffffffffff34;
  Transform *in_stack_ffffffffffffff38;
  Float in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 local_94 [128];
  float local_14;
  long local_10;
  undefined1 auVar3 [64];
  
  local_10 = in_RSI;
  AnimatedTransform::AnimatedTransform
            ((AnimatedTransform *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  Transform::Transform(in_stack_fffffffffffff960);
  iVar1 = *(int *)(Options + 0x10);
  if (iVar1 == 0) {
    local_14 = (*(float *)(local_10 + 0x100) + *(float *)(local_10 + 0x104)) / 2.0;
    AnimatedTransform::Interpolate(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
    memcpy(in_RDI[5].m.m[3] + 2,local_94,0x80);
  }
  else if (iVar1 == 1) {
    fVar7 = (float)((ulong)local_10 >> 0x20);
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffff960,in_stack_fffffffffffff95c,
               in_stack_fffffffffffff958,0.0);
    in_stack_ffffffffffffff38 =
         (Transform *)CONCAT44(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    auVar4 = ZEXT856(0);
    PVar5 = AnimatedTransform::operator()
                      (in_stack_fffffffffffffa88,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa84
                      );
    local_178 = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
    auVar2._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar2._8_56_ = auVar4;
    local_180 = vmovlpd_avx(auVar2._0_16_);
    PVar6.super_Tuple3<pbrt::Point3,_float>._4_8_ = in_RDI;
    PVar6.super_Tuple3<pbrt::Point3,_float>.x = fVar7;
    local_170 = local_180;
    local_168 = local_178;
    local_d8 = local_180;
    local_d0 = local_178;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x8a5f3d,PVar6);
    local_188 = local_15c;
    local_190 = local_164;
    Translate((Vector3f)in_stack_fffffffffffffa2c);
    memcpy(in_RDI[5].m.m[3] + 2,local_158,0x80);
  }
  else {
    if (iVar1 != 2) {
      LogFatal(in_stack_fffffffffffffa24,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
               in_stack_fffffffffffffa08);
    }
    memset(local_210,0,0x80);
    Transform::Transform(in_stack_fffffffffffff960);
    memcpy(in_RDI[5].m.m[3] + 2,local_210,0x80);
  }
  if (logging::logLevel < 1) {
    Point3<float>::Point3
              ((Point3<float> *)(in_RDI[5].m.m[3] + 2),in_stack_fffffffffffff95c,
               in_stack_fffffffffffff958,0.0);
    auVar4 = ZEXT856(0);
    PVar6 = Transform::operator()(in_stack_fffffffffffffae8,in_stack_fffffffffffffb00);
    auVar3._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar4;
    vmovlpd_avx(auVar3._0_16_);
    Log<pbrt::Point3<float>>
              (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,
               in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
  }
  Inverse(in_RDI);
  Transform::operator*(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  Transform::operator*(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  AnimatedTransform::AnimatedTransform
            ((AnimatedTransform *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (Transform *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
  memcpy(in_RDI,local_680,0x2b8);
  return;
}

Assistant:

CameraTransform::CameraTransform(const AnimatedTransform &worldFromCamera) {
    switch (Options->renderingSpace) {
    case RenderingCoordinateSystem::Camera: {
        // Compute _worldFromRender_ for camera-space rendering
        Float tMid = (worldFromCamera.startTime + worldFromCamera.endTime) / 2;
        worldFromRender = worldFromCamera.Interpolate(tMid);
        break;
    }
    case RenderingCoordinateSystem::CameraWorld: {
        // Compute _worldFromRender_ for camera-world space rendering
        Float tMid = (worldFromCamera.startTime + worldFromCamera.endTime) / 2;
        Point3f pCamera = worldFromCamera(Point3f(0, 0, 0), tMid);
        worldFromRender = Translate(Vector3f(pCamera));
        break;
    }
    case RenderingCoordinateSystem::World: {
        // Compute _worldFromRender_ for world-space rendering
        worldFromRender = Transform();
        break;
    }
    default:
        LOG_FATAL("Unhandled rendering coordinate space");
    }
    LOG_VERBOSE("World-space position: %s", worldFromRender(Point3f(0, 0, 0)));
    // Compute _renderFromCamera_ transformation
    Transform renderFromWorld = Inverse(worldFromRender);
    Transform rfc[2] = {renderFromWorld * worldFromCamera.startTransform,
                        renderFromWorld * worldFromCamera.endTransform};
    renderFromCamera = AnimatedTransform(rfc[0], worldFromCamera.startTime, rfc[1],
                                         worldFromCamera.endTime);
}